

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLinePointsNonindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  GLfloat *pGVar3;
  AdjacencyGridLineSegment *pAVar4;
  AdjacencyGridLineSegment *segmentPtr;
  GLfloat *pGStack_30;
  uint n;
  float *travellerPtr;
  float *travellerExpectedGeometryPtr;
  float *travellerExpectedAdjacencyGeometryPtr;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  test_data->m_n_vertices = test_data->m_grid->m_n_segments << 1;
  test_data->m_geometry_bo_size = test_data->m_n_vertices * this->m_n_components_output * 4;
  test_data->m_vertex_data_bo_size = test_data->m_n_vertices * this->m_n_components_input * 8;
  auVar1 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_expected_adjacency_geometry = pGVar3;
  auVar1 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_expected_geometry = pGVar3;
  auVar1 = ZEXT416(test_data->m_vertex_data_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_vertex_data = pGVar3;
  travellerExpectedGeometryPtr = test_data->m_expected_adjacency_geometry;
  travellerPtr = test_data->m_expected_geometry;
  pGStack_30 = test_data->m_vertex_data;
  for (segmentPtr._4_4_ = 0; segmentPtr._4_4_ < test_data->m_grid->m_n_segments;
      segmentPtr._4_4_ = segmentPtr._4_4_ + 1) {
    pAVar4 = test_data->m_grid->m_line_segments + segmentPtr._4_4_;
    *pGStack_30 = pAVar4->m_point_start_adjacent->x;
    pGStack_30[1] = pAVar4->m_point_start_adjacent->y;
    pGStack_30[2] = pAVar4->m_point_start->x;
    pGStack_30[3] = pAVar4->m_point_start->y;
    pGStack_30[4] = pAVar4->m_point_end->x;
    pGStack_30[5] = pAVar4->m_point_end->y;
    pGStack_30[6] = pAVar4->m_point_end_adjacent->x;
    pGStack_30[7] = pAVar4->m_point_end_adjacent->y;
    pGStack_30 = pGStack_30 + 8;
    *travellerExpectedGeometryPtr = pAVar4->m_point_start_adjacent->x;
    travellerExpectedGeometryPtr[1] = pAVar4->m_point_start_adjacent->y;
    travellerExpectedGeometryPtr[2] = 0.0;
    travellerExpectedGeometryPtr[3] = 1.0;
    travellerExpectedGeometryPtr[4] = pAVar4->m_point_end_adjacent->x;
    travellerExpectedGeometryPtr[5] = pAVar4->m_point_end_adjacent->y;
    travellerExpectedGeometryPtr[6] = 0.0;
    travellerExpectedGeometryPtr[7] = 1.0;
    travellerExpectedGeometryPtr = travellerExpectedGeometryPtr + 8;
    *travellerPtr = pAVar4->m_point_start->x;
    travellerPtr[1] = pAVar4->m_point_start->y;
    travellerPtr[2] = 0.0;
    travellerPtr[3] = 1.0;
    travellerPtr[4] = pAVar4->m_point_end->x;
    travellerPtr[5] = pAVar4->m_point_end->y;
    travellerPtr[6] = 0.0;
    travellerPtr[7] = 1.0;
    travellerPtr = travellerPtr + 8;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLinePointsNonindiced(AdjacencyTestData& test_data)
{
	float* travellerExpectedAdjacencyGeometryPtr = 0;
	float* travellerExpectedGeometryPtr			 = 0;
	float* travellerPtr							 = 0;

	/* Set buffer sizes */
	test_data.m_n_vertices = test_data.m_grid->m_n_segments * 2 /* start + end points form a segment */;
	test_data.m_geometry_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_output * sizeof(float));
	test_data.m_vertex_data_bo_size = static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input *
															   2 /* include adjacency info */ * sizeof(float));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_grid->m_n_segments; ++n)
	{
		AdjacencyGridLineSegment* segmentPtr = test_data.m_grid->m_line_segments + n;

		*travellerPtr = segmentPtr->m_point_start_adjacent->x;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_start_adjacent->y;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_start->x;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_start->y;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_end->x;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_end->y;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_end_adjacent->x;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_end_adjacent->y;
		++travellerPtr;

		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all line segments) */
}